

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<100,_std::complex<long_double>_>::TPZFNMatrix
          (TPZFNMatrix<100,_std::complex<long_double>_> *this,int64_t row,int64_t col,
          complex<long_double> *val)

{
  complex<long_double> value;
  complex<long_double> *in_RCX;
  int64_t in_RDX;
  int64_t in_RSI;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  TPZFMatrix<std::complex<long_double>_> *unaff_retaddr;
  TPZFMatrix<std::complex<long_double>_> *local_70;
  int64_t sz;
  TPZFMatrix<std::complex<long_double>_> *vtt;
  
  sz = 0;
  vtt = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<100,std::complex<long_double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  (in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_023f96d0;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (unaff_retaddr,(void **)vtt,in_RSI,in_RDX,in_RCX,sz);
  (in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_023f96d0;
  local_70 = in_RDI + 1;
  do {
    std::complex<long_double>::complex((complex<long_double> *)local_70,(longdouble)0,(longdouble)0)
    ;
    local_70 = (TPZFMatrix<std::complex<long_double>_> *)&local_70->fElem;
  } while (local_70 !=
           (TPZFMatrix<std::complex<long_double>_> *)&in_RDI[0x17].fPivot.super_TPZVec<int>.fStore);
  value._M_value._10_6_ = (int6)((ulong)*(undefined8 *)(in_RCX->_M_value + 8) >> 0x10);
  value._M_value._0_10_ = *(unkbyte10 *)in_RCX->_M_value;
  value._M_value._16_8_ = *(undefined8 *)(in_RCX->_M_value + 0x10);
  value._M_value._24_2_ = (short)*(undefined8 *)(in_RCX->_M_value + 0x18);
  value._M_value._26_6_ = (int6)((ulong)*(undefined8 *)(in_RCX->_M_value + 0x18) >> 0x10);
  TPZFMatrix<std::complex<long_double>_>::operator=(in_RDI,value);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }